

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void libdef_lua(BuildCtx *ctx,char *p,int arg)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  size_t __n;
  uint8_t uVar6;
  long lVar7;
  uint32_t local_2c;
  
  if (ctx->mode == BUILD_libdef) {
    lVar5 = 0;
    while( true ) {
      if (lVar5 == 0x80) {
        fprintf(_stderr,"Error: missing libbc definition for %s\n",p);
        exit(1);
      }
      iVar3 = strcmp(*(char **)((long)&libbc_map[0].name + lVar5),p);
      if (iVar3 == 0) break;
      lVar5 = lVar5 + 0x10;
    }
    lVar7 = (long)*(int *)((long)&libbc_map[0].ofs + lVar5);
    __n = *(int *)((long)&libbc_map[1].ofs + lVar5) - lVar7;
    obuf[2] = obuf[2] + '\x01';
    puVar2 = optr + 1;
    *optr = 0xf9;
    optr = puVar2;
    libdef_name(p,0);
    puVar2 = optr;
    memcpy(optr,"" + lVar7,__n);
    puVar4 = libdef_uleb128(puVar2 + 4,&local_2c);
    puVar4 = libdef_uleb128(puVar4,&local_2c);
    puVar4 = libdef_uleb128(puVar4,&local_2c);
    for (lVar5 = 0; local_2c != (uint32_t)lVar5; lVar5 = lVar5 + 1) {
      uVar6 = puVar4[lVar5 * 4 + 2];
      uVar1 = puVar4[lVar5 * 4];
      if (uVar6 == '\x0e' && puVar4[lVar5 * 4] == '\x10') {
        uVar6 = '\x0f';
        uVar1 = '\x11';
      }
      puVar4[lVar5 * 4] = uVar1;
      puVar4[lVar5 * 4 + 2] = uVar6;
    }
    optr = puVar2 + __n;
  }
  return;
}

Assistant:

static void libdef_lua(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int i;
    for (i = 0; libbc_map[i].name != NULL; i++) {
      if (!strcmp(libbc_map[i].name, p)) {
	int ofs = libbc_map[i].ofs;
	int len = libbc_map[i+1].ofs - ofs;
	obuf[2]++;  /* Bump hash table size. */
	*optr++ = LIBINIT_LUA;
	libdef_name(p, 0);
	memcpy(optr, libbc_code + ofs, len);
	libdef_fixupbc(optr);
	optr += len;
	return;
      }
    }
    fprintf(stderr, "Error: missing libbc definition for %s\n", p);
    exit(1);
  }
}